

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextRankExtractor.hpp
# Opt level: O2

void __thiscall
cppjieba::TextRankExtractor::WordGraph::rank(WordGraph *this,WordMap *ws,size_t rankTime)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  double dVar3;
  _Base_ptr p_Var4;
  iterator i;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  size_t sVar10;
  _Rb_tree_node_base *p_Var11;
  iterator i_1;
  _Self __tmp;
  undefined1 auVar12 [16];
  _Base_ptr p_Var13;
  _Self __tmp_1;
  WordMap outSum;
  double local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  sVar10 = (this->graph)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (sVar10 != 0) {
    auVar12._8_4_ = (int)(sVar10 >> 0x20);
    auVar12._0_8_ = sVar10;
    auVar12._12_4_ = 0x45300000;
    for (p_Var7 = (this->graph)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(this->graph)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      p_Var11 = p_Var7 + 1;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
               ::operator[](ws,(key_type *)p_Var11);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
               ::operator[](ws,(key_type *)p_Var11);
      pmVar5->weight =
           1.0 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0));
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
                             *)&local_60,(key_type *)p_Var11);
      pmVar5->weight = 0.0;
      for (p_Var6 = p_Var7[2]._M_right; p_Var6 != (_Base_ptr)&p_Var7[2]._M_parent;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        dVar2 = *(double *)(p_Var6 + 2);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
                               *)&local_60,(key_type *)p_Var11);
        pmVar5->weight = dVar2 + pmVar5->weight;
      }
    }
    for (sVar10 = 0; sVar10 != rankTime; sVar10 = sVar10 + 1) {
      for (p_Var6 = (this->nodeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->nodeSet)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        p_Var7 = p_Var6 + 1;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                 ::operator[](&this->graph,(key_type *)p_Var7);
        p_Var9 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_98 = 0.0;
        while( true ) {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                   ::operator[](&this->graph,(key_type *)p_Var7);
          if ((_Rb_tree_header *)p_Var9 == &(pmVar8->_M_t)._M_impl.super__Rb_tree_header) break;
          dVar2 = *(double *)(p_Var9 + 2);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
                                 *)&local_60,(key_type *)(p_Var9 + 1));
          dVar3 = pmVar5->weight;
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
                   ::operator[](ws,(key_type *)(p_Var9 + 1));
          local_98 = local_98 + (dVar2 / dVar3) * pmVar5->weight;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        }
        dVar2 = this->d;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
                 ::operator[](ws,(key_type *)p_Var7);
        pmVar5->weight = local_98 * dVar2 + (1.0 - dVar2);
      }
    }
    p_Var7 = (ws->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = p_Var7[3]._M_right;
    p_Var1 = &(ws->_M_t)._M_impl.super__Rb_tree_header;
    p_Var11 = p_Var7;
    p_Var9 = p_Var6;
    while ((_Rb_tree_header *)p_Var11 != p_Var1) {
      p_Var13 = p_Var11[3]._M_right;
      p_Var4 = p_Var13;
      if ((double)p_Var6 <= (double)p_Var13) {
        p_Var4 = p_Var6;
      }
      p_Var6 = p_Var4;
      if ((double)p_Var13 <= (double)p_Var9) {
        p_Var13 = p_Var9;
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      p_Var9 = p_Var13;
    }
    for (; (_Rb_tree_header *)p_Var7 != p_Var1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      p_Var13 = p_Var7[3]._M_right;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
               ::operator[](ws,(key_type *)(p_Var7 + 1));
      pmVar5->weight =
           ((double)p_Var13 - (double)p_Var6 / 10.0) / ((double)p_Var9 - (double)p_Var6 / 10.0);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::TextRankExtractor::_Word>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void rank(WordMap &ws,size_t rankTime=10){
        WordMap outSum;
        Score wsdef, min_rank, max_rank;

        if( graph.size() == 0)
          return;

        wsdef = 1.0 / graph.size();

        for(Graph::iterator edges=graph.begin();edges!=graph.end();++edges){
          // edges->first start节点；edge->first end节点；edge->second 权重
          ws[edges->first].word=edges->first;
          ws[edges->first].weight=wsdef;
          outSum[edges->first].weight=0;
          for(Edges::iterator edge=edges->second.begin();edge!=edges->second.end();++edge){
            outSum[edges->first].weight+=edge->second;
          }
        }
        //sort(nodeSet.begin(),nodeSet.end()); 是否需要排序?
        for( size_t i=0; i<rankTime; i++ ){
          for(NodeSet::iterator node = nodeSet.begin(); node != nodeSet.end(); node++ ){
            double s = 0;
            for( Edges::iterator edge= graph[*node].begin(); edge != graph[*node].end(); edge++ )
              // edge->first end节点；edge->second 权重
              s += edge->second / outSum[edge->first].weight * ws[edge->first].weight;
            ws[*node].weight = (1 - d) + d * s;
          }
        }

        min_rank=max_rank=ws.begin()->second.weight;
        for(WordMap::iterator i = ws.begin(); i != ws.end(); i ++){
          if( i->second.weight < min_rank ){
            min_rank = i->second.weight;
          }
          if( i->second.weight > max_rank ){
            max_rank = i->second.weight;
          }
        }
        for(WordMap::iterator i = ws.begin(); i != ws.end(); i ++){
          ws[i->first].weight = (i->second.weight - min_rank / 10.0) / (max_rank - min_rank / 10.0);
        }
      }